

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall BpTree<int>::FindKey(BpTree<int> *this,int k,IndexNode<int> *C)

{
  pointer pcVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Addr *pAVar7;
  ulong uVar8;
  ulong uVar9;
  IndexNode<int> D;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&D,this->N);
  uVar6 = 0xffffffff;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,C);
LAB_0012b3da:
    uVar4 = this->N - 1;
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    pcVar1 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (C->NodeState != '1') {
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        if ((pcVar1[uVar8] != '1') || (k <= piVar2[uVar8])) {
          uVar5 = uVar8 & 0xffffffff;
          break;
        }
      }
      if (((uint)uVar5 == uVar4) || (pcVar1[uVar5] == '0')) goto LAB_0012b421;
      if (piVar2[uVar5] != k) goto LAB_0012b48e;
      FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5],&D);
      IndexNode<int>::IndexNode(&local_90,&D);
      iVar3 = HaveK(this,&local_90,k);
      IndexNode<int>::~IndexNode(&local_90);
      pAVar7 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5 + (iVar3 == 0);
      goto LAB_0012b429;
    }
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar4) {
      uVar9 = (ulong)uVar4;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      if ((pcVar1[uVar8] != '1') || (piVar2[uVar8] == k)) {
        uVar5 = uVar8 & 0xffffffff;
        break;
      }
    }
    uVar6 = 0xffffffff;
    if (((uint)uVar5 != uVar4) && (uVar6 = 0xffffffff, pcVar1[uVar5] != '0')) {
      uVar6 = (uint)uVar5;
    }
  }
  IndexNode<int>::~IndexNode(&D);
  return uVar6;
LAB_0012b48e:
  if (k < piVar2[uVar5]) {
LAB_0012b421:
    pAVar7 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar5;
LAB_0012b429:
    FindNode(this,*pAVar7,C);
  }
  goto LAB_0012b3da;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}